

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

TabPosition __thiscall QMainWindow::tabPosition(QMainWindow *this,DockWidgetArea area)

{
  bool bVar1;
  TabPosition TVar2;
  
  bVar1 = checkDockWidgetArea(area,"QMainWindow::tabPosition");
  if (bVar1) {
    TVar2 = QMainWindowLayout::tabPosition
                      (*(QMainWindowLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260),
                       area);
    return TVar2;
  }
  return South;
}

Assistant:

QTabWidget::TabPosition QMainWindow::tabPosition(Qt::DockWidgetArea area) const
{
    if (!checkDockWidgetArea(area, "QMainWindow::tabPosition"))
        return QTabWidget::South;
    return d_func()->layout->tabPosition(area);
}